

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture_p.h
# Opt level: O2

void __thiscall QSwipeGesturePrivate::QSwipeGesturePrivate(QSwipeGesturePrivate *this)

{
  QGesturePrivate::QGesturePrivate(&this->super_QGesturePrivate);
  *(undefined ***)&this->super_QGesturePrivate = &PTR__QObjectPrivate_007c04e8;
  *(undefined4 *)&(this->super_QGesturePrivate).field_0xa4 = 0;
  this->verticalDirection = NoDirection;
  this->velocityValue = 0.0;
  this->swipeAngle = 0.0;
  this->lastPositions[0].xp = 0;
  this->lastPositions[0].yp = 0;
  this->state = NoGesture;
  this->lastPositions[1].xp = 0;
  this->lastPositions[1].yp = 0;
  this->lastPositions[2].xp = 0;
  this->lastPositions[2].yp = 0;
  (this->time).t1 = -0x8000000000000000;
  (this->time).t2 = -0x8000000000000000;
  return;
}

Assistant:

QSwipeGesturePrivate()
        : horizontalDirection(QSwipeGesture::NoDirection),
          verticalDirection(QSwipeGesture::NoDirection),
          swipeAngle(0),
          state(NoGesture), velocityValue(0)
    {
    }